

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

int __thiscall kj::anon_unknown_35::InMemoryFile::stat(InMemoryFile *this,char *__file,stat *__buf)

{
  _func_int **pp_Var1;
  undefined8 uVar2;
  Locked<const_kj::(anonymous_namespace)::InMemoryFile::Impl> lock;
  
  kj::_::Mutex::lock((Mutex *)(__file + 0x18),SHARED);
  lock.ptr = (Impl *)(__file + 0x30);
  *(undefined4 *)&(this->super_File).super_ReadableFile.super_FsNode._vptr_FsNode = 0;
  pp_Var1 = *(_func_int ***)(__file + 0x50);
  uVar2 = *(undefined8 *)(__file + 0x58);
  (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = pp_Var1;
  *(_func_int ***)&(this->super_AtomicRefcounted).refcount = pp_Var1;
  *(undefined8 *)&(this->impl).mutex = uVar2;
  *(undefined4 *)&(this->impl).mutex.waitersHead.ptr = 1;
  (this->impl).mutex.waitersTail = (Maybe<kj::_::Mutex::Waiter_&> *)__file;
  lock.mutex = (Mutex *)(__file + 0x18);
  Locked<const_kj::(anonymous_namespace)::InMemoryFile::Impl>::~Locked(&lock);
  return (int)this;
}

Assistant:

Metadata stat() const override {
    auto lock = impl.lockShared();
    uint64_t hash = reinterpret_cast<uintptr_t>(this);
    return Metadata { Type::FILE, lock->size, lock->size, lock->lastModified, 1, hash };
  }